

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_55(LParser *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  shared_ptr<LNode> local_60;
  shared_ptr<LNode> local_50 [2];
  undefined1 local_29;
  shared_ptr<LNode> var;
  LParser *this_local;
  shared_ptr<LNode> *vars;
  
  get_node((LParser *)&stack0xffffffffffffffd8,in_ESI);
  local_29 = 0;
  get_node(this,in_ESI);
  std::shared_ptr<LNode>::shared_ptr(&local_60,(shared_ptr<LNode> *)this);
  lnode_get<LNodeChildren>(local_50);
  peVar1 = std::
           __shared_ptr_access<LNodeData<LNodeChildren>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<LNodeData<LNodeChildren>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  LNodeChildren::push_front(&peVar1->value,(shared_ptr<LNode> *)&stack0xffffffffffffffd8);
  std::shared_ptr<LNodeData<LNodeChildren>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeChildren>_> *)local_50);
  std::shared_ptr<LNode>::~shared_ptr(&local_60);
  local_29 = 1;
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)&stack0xffffffffffffffd8);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_55() {
    // Vars : Var Vars
    auto var = this->get_node(2);
    auto vars = this->get_node(1);
    lnode_get<LNodeChildren>(vars)->value.push_front(std::move(var));
    return vars;
}